

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void initialize_random_artifacts(uint32_t randart_seed)

{
  _Bool _Var1;
  ang_file *f;
  artifact *art_00;
  artifact *art;
  wchar_t i;
  ang_file *randart_file;
  char fname [1024];
  uint32_t randart_seed_local;
  
  Rand_quick = true;
  Rand_value = randart_seed;
  path_build((char *)&randart_file,0x400,ANGBAND_DIR_USER,"randart.txt");
  f = file_open((char *)&randart_file,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    quit_fmt("Error - can\'t create %s.",&randart_file);
  }
  file_putf(f,"# Artifact file for random artifacts with seed %08x\n\n\n",(ulong)randart_seed);
  a_info = (artifact *)mem_realloc(a_info,(long)(int)(z_info->a_max + 0x28) * 0x140);
  aup_info = (artifact_upkeep *)mem_realloc(aup_info,(long)(int)(z_info->a_max + 0x28) << 3);
  for (art._4_4_ = 0; art._4_4_ < 0x28; art._4_4_ = art._4_4_ + 1) {
    art_00 = a_info + z_info->a_max;
    memset(art_00,0,0x140);
    memset(aup_info + z_info->a_max,0,8);
    aup_info[z_info->a_max].aidx = (uint)z_info->a_max;
    design_random_artifact(art_00);
    art_00->aidx = (uint)z_info->a_max;
    write_randart_file_entry(f,art_00);
    z_info->a_max = z_info->a_max + 1;
  }
  _Var1 = file_close(f);
  if (!_Var1) {
    quit_fmt("Error - can\'t close %s.",&randart_file);
  }
  return;
}

Assistant:

void initialize_random_artifacts(uint32_t randart_seed)
{
	char fname[1024];
	ang_file *randart_file = NULL;
	int i;

	/* Prepare to use the Angband "simple" RNG. */
	Rand_value = randart_seed;
	Rand_quick = true;

	/* Open the file, write a header */
	path_build(fname, sizeof(fname), ANGBAND_DIR_USER, "randart.txt");
	randart_file = file_open(fname, MODE_WRITE, FTYPE_TEXT);
	if (!randart_file) {
		quit_fmt("Error - can't create %s.", fname);
	}
	file_putf(randart_file,
			  "# Artifact file for random artifacts with seed %08x\n\n\n",
			  randart_seed);

	/* Initialize, name and write artifacts to the file */
	a_info = mem_realloc(a_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*a_info));
	aup_info = mem_realloc(aup_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*aup_info));
	for (i = 0; i < ART_NUM_RANDOM; i++) {
		/* Extend the artifact array with a zero entry */
		struct artifact *art;
		art = &a_info[z_info->a_max];
		memset(art, 0, sizeof(*art));
		memset(&aup_info[z_info->a_max], 0, sizeof(*aup_info));
		aup_info[z_info->a_max].aidx = z_info->a_max;

		/* Design the artifact, storing information as we go along. */
		design_random_artifact(art);
		art->aidx = z_info->a_max;

		/* Write the entry to the randart file */
		write_randart_file_entry(randart_file, art);

		z_info->a_max += 1;
	}

	/* Close the file */
	if (!file_close(randart_file)) {
		quit_fmt("Error - can't close %s.", fname);
	}
}